

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Integer MA_inquire_heap_check_stack(Integer datatype)

{
  ulong datatype_00;
  Integer min_nelem;
  Integer IVar1;
  ulong length;
  ErrorLevel elevel;
  
  ma_stats.calls[0xf] = ma_stats.calls[0xf] + 1;
  if (ma_initialized == '\0') {
    builtin_strncpy(ma_ebuf,"MA not yet initialized",0x17);
    elevel = EL_Nonfatal;
  }
  else {
    datatype_00 = datatype - 1000;
    if (datatype_00 < 0x11) {
      length = (long)ma_partition - (long)ma_hp;
      if ((ulong)((long)ma_sp - (long)ma_hp) < (ulong)((long)ma_partition - (long)ma_hp)) {
        length = (long)ma_sp - (long)ma_hp;
      }
      if (length == 0) {
        min_nelem = 0;
      }
      else {
        min_nelem = ma_nelem(ma_hp,length,datatype_00);
      }
      IVar1 = ma_max_heap_frag_nelem(datatype_00,min_nelem);
      if (min_nelem < IVar1) {
        return IVar1;
      }
      return min_nelem;
    }
    sprintf(ma_ebuf,"invalid datatype: %ld",datatype);
    elevel = EL_Fatal;
  }
  ma_error(elevel,ET_External,"MA_inquire_heap_check_stack",ma_ebuf);
  return 0;
}

Assistant:

public Integer MA_inquire_heap_check_stack(Integer datatype)
{
    size_t    gap_length;    /* # of bytes between heap and partition */
    Integer    nelem_gap;    /* max elements containable in gap */
    Integer    nelem_frag;    /* max elements containable in any frag */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_inquire_heap_check_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return DONTCARE;
#endif /* VERIFY */

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "MA not yet initialized");
        ma_error(EL_Nonfatal, ET_External, "MA_inquire_heap_check_stack", ma_ebuf);
        return (Integer)0;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Fatal, ET_External, "MA_inquire_heap_check_stack", ma_ebuf);
        return DONTCARE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * compute the # of elements for which space is available
     */

    /* try space between heap and partition or heap and stack */
    gap_length = min((size_t)(ma_partition - ma_hp), (size_t)(ma_sp - ma_hp));
    if (gap_length > 0)
        nelem_gap = ma_nelem(ma_hp, (ulongi)gap_length, datatype);
    else
        nelem_gap = 0;

    /* try heap fragments */
    nelem_frag = ma_max_heap_frag_nelem(datatype, nelem_gap);

    /* success */
    return max(nelem_gap, nelem_frag);
}